

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_resampler_passthrough_duplex_callback_reordering_Test::TestBody
          (cubeb_resampler_passthrough_duplex_callback_reordering_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  AssertionResult gtest_ar_2;
  long normal_input_frame_count;
  long zero;
  long frames;
  uint32_t i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  long got;
  long prebuffer_frames;
  long output_seq_idx;
  long seq_idx;
  float output_buffer [512];
  float input_buffer_normal [256];
  float input_buffer_glitch [512];
  float input_buffer_prebuffer [512];
  long BUF_BASE_SIZE;
  cubeb_resampler *resampler;
  closure c;
  int target_rate;
  int output_channels;
  int input_channels;
  cubeb_stream_params output_params;
  cubeb_stream_params input_params;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffe2ec;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffe2f4;
  long *in_stack_ffffffffffffe2f8;
  AssertHelper in_stack_ffffffffffffe300;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffe308;
  uint in_stack_ffffffffffffe314;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffe318;
  cubeb_stream_params *in_stack_ffffffffffffe320;
  cubeb_stream *in_stack_ffffffffffffe328;
  long lVar6;
  uint stride;
  cubeb_resampler_quality in_stack_ffffffffffffe340;
  undefined4 in_stack_ffffffffffffe344;
  cubeb_resampler_reclock in_stack_ffffffffffffe348;
  AssertionResult local_1cb0;
  uint local_1c9c;
  AssertHelper local_1c98;
  Message local_1c90;
  AssertionResult local_1c88;
  long local_1c78;
  ulong local_1c70;
  long local_1c68;
  long local_1c60;
  float local_1458 [256];
  float local_1058 [512];
  float local_858 [514];
  undefined8 local_50;
  cubeb_resampler *local_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_1c;
  undefined4 local_18;
  uint local_14;
  
  local_34 = 1;
  local_38 = 2;
  local_14 = 1;
  local_18 = 0xac44;
  local_1c = 2;
  local_28 = 2;
  local_2c = 0xac44;
  local_30 = 2;
  local_3c = 0xac44;
  local_40 = 1;
  uVar4 = 0;
  uVar5 = 0;
  local_48 = cubeb_resampler_create
                       (in_stack_ffffffffffffe328,in_stack_ffffffffffffe320,
                        (cubeb_stream_params *)in_stack_ffffffffffffe318.ptr_,
                        in_stack_ffffffffffffe314,
                        (cubeb_data_callback)in_stack_ffffffffffffe308.ptr_,
                        in_stack_ffffffffffffe300.data_,in_stack_ffffffffffffe340,
                        in_stack_ffffffffffffe348);
  local_50 = 0x100;
  local_1c60 = 0;
  local_1c68 = 0;
  sVar2 = ARRAY_LENGTH<float,512ul>((float (*) [512])local_858);
  local_1c70 = sVar2 / local_14;
  local_1c60 = seq<float>(local_858,1,local_1c60,local_1c70);
  local_1c78 = cubeb_resampler_fill
                         ((cubeb_resampler *)in_stack_ffffffffffffe300.data_,
                          in_stack_ffffffffffffe2f8,
                          (long *)CONCAT44(in_stack_ffffffffffffe2f4,uVar5),
                          (void *)CONCAT44(in_stack_ffffffffffffe2ec,uVar4),0x10b605);
  local_1c68 = local_1c68 + 0x100;
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)in_stack_ffffffffffffe308.ptr_,(char *)in_stack_ffffffffffffe300.data_,
             in_stack_ffffffffffffe2f8,(long *)CONCAT44(in_stack_ffffffffffffe2f4,uVar5));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe300.data_);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10b67d);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x2fe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c98,&local_1c90);
    testing::internal::AssertHelper::~AssertHelper(&local_1c98);
    testing::Message::~Message((Message *)0x10b6cd);
  }
  local_1c9c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b6ec);
  if (local_1c9c == 0) {
    testing::internal::EqHelper<false>::Compare<long,long>
              ((char *)in_stack_ffffffffffffe308.ptr_,(char *)in_stack_ffffffffffffe300.data_,
               in_stack_ffffffffffffe2f8,(long *)CONCAT44(in_stack_ffffffffffffe2f4,uVar5));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1cb0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffe300.data_);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10b749);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffe340,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x2ff,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffe340,(Message *)&stack0xffffffffffffe348);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe340);
      testing::Message::~Message((Message *)0x10b78a);
    }
    local_1c9c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b7a6);
    if (local_1c9c == 0) {
      for (stride = 0; stride < 300; stride = stride + 1) {
        lVar6 = 0x100;
        if ((stride == 0) || (stride % 100 != 0)) {
          if ((stride == 0) || (stride % 100 != 1)) {
            local_1c60 = seq<float>(local_1458,1,local_1c60,0x100);
            local_1c78 = cubeb_resampler_fill
                                   ((cubeb_resampler *)in_stack_ffffffffffffe300.data_,
                                    in_stack_ffffffffffffe2f8,
                                    (long *)CONCAT44(in_stack_ffffffffffffe2f4,uVar5),
                                    (void *)CONCAT44(in_stack_ffffffffffffe2ec,uVar4),0x10b977);
            is_seq<float>((float *)CONCAT44(in_stack_ffffffffffffe344,in_stack_ffffffffffffe340),
                          stride,lVar6,(long)in_stack_ffffffffffffe328);
          }
          else {
            local_1c60 = seq<float>(local_1058,1,local_1c60,0x200);
            lVar6 = 0x200;
            local_1c78 = cubeb_resampler_fill
                                   ((cubeb_resampler *)in_stack_ffffffffffffe300.data_,
                                    in_stack_ffffffffffffe2f8,
                                    (long *)CONCAT44(in_stack_ffffffffffffe2f4,uVar5),
                                    (void *)CONCAT44(in_stack_ffffffffffffe2ec,uVar4),0x10b8dd);
            is_seq<float>((float *)CONCAT44(in_stack_ffffffffffffe344,in_stack_ffffffffffffe340),
                          stride,lVar6,(long)in_stack_ffffffffffffe328);
          }
        }
        else {
          in_stack_ffffffffffffe328 = (cubeb_stream *)0x0;
          local_1c78 = cubeb_resampler_fill
                                 ((cubeb_resampler *)in_stack_ffffffffffffe300.data_,
                                  in_stack_ffffffffffffe2f8,
                                  (long *)CONCAT44(in_stack_ffffffffffffe2f4,uVar5),
                                  (void *)CONCAT44(in_stack_ffffffffffffe2ec,uVar4),0x10b822);
          is_seq<float>((float *)CONCAT44(in_stack_ffffffffffffe344,in_stack_ffffffffffffe340),
                        stride,lVar6,(long)in_stack_ffffffffffffe328);
        }
        local_1c68 = local_1c68 + 0x100;
        testing::internal::EqHelper<false>::Compare<long,long>
                  ((char *)in_stack_ffffffffffffe308.ptr_,(char *)in_stack_ffffffffffffe300.data_,
                   in_stack_ffffffffffffe2f8,(long *)CONCAT44(in_stack_ffffffffffffe2f4,uVar5));
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffe310);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffe300.data_);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10ba04);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffe300,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                     ,0x31a,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffe300,(Message *)&stack0xffffffffffffe308);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe300);
          testing::Message::~Message((Message *)0x10ba45);
        }
        local_1c9c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ba61);
        if (local_1c9c != 0) {
          return;
        }
      }
      cubeb_resampler_destroy((cubeb_resampler *)CONCAT44(in_stack_ffffffffffffe2f4,uVar5));
    }
  }
  return;
}

Assistant:

TEST(cubeb, resampler_passthrough_duplex_callback_reordering)
{
  // Test that when pre-buffering on resampler creation, we can survive an input
  // callback being delayed.

  cubeb_stream_params input_params;
  cubeb_stream_params output_params;

  const int input_channels = 1;
  const int output_channels = 2;

  input_params.channels = input_channels;
  input_params.rate = 44100;
  input_params.format = CUBEB_SAMPLE_FLOAT32NE;

  output_params.channels = output_channels;
  output_params.rate = input_params.rate;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;

  int target_rate = input_params.rate;

  closure c;
  c.input_channel_count = input_channels;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params,
                           target_rate, cb_passthrough_resampler_duplex, &c,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  const long BUF_BASE_SIZE = 256;
  float input_buffer_prebuffer[input_channels * BUF_BASE_SIZE * 2];
  float input_buffer_glitch[input_channels * BUF_BASE_SIZE * 2];
  float input_buffer_normal[input_channels * BUF_BASE_SIZE];
  float output_buffer[output_channels * BUF_BASE_SIZE];

  long seq_idx = 0;
  long output_seq_idx = 0;

  long prebuffer_frames = ARRAY_LENGTH(input_buffer_prebuffer) / input_params.channels;
  seq_idx = seq(input_buffer_prebuffer, input_channels, seq_idx,
                prebuffer_frames);

  long got = cubeb_resampler_fill(resampler, input_buffer_prebuffer, &prebuffer_frames,
                                  output_buffer, BUF_BASE_SIZE);

  output_seq_idx += BUF_BASE_SIZE;

  // prebuffer_frames will hold the frames used by the resampler.
  ASSERT_EQ(prebuffer_frames, BUF_BASE_SIZE);
  ASSERT_EQ(got, BUF_BASE_SIZE);

  for (uint32_t i = 0; i < 300; i++) {
    long int frames = BUF_BASE_SIZE;
    // Simulate that sometimes, we don't have the input callback on time
    if (i != 0 && (i % 100) == 0) {
      long zero = 0;
      got = cubeb_resampler_fill(resampler, input_buffer_normal /* unused here */,
                                 &zero, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    } else if (i != 0 && (i % 100) == 1) {
      // if this is the case, the on the next iteration, we'll have twice the
      // amount of input frames
      seq_idx = seq(input_buffer_glitch, input_channels, seq_idx, BUF_BASE_SIZE * 2);
      frames = 2 * BUF_BASE_SIZE;
      got = cubeb_resampler_fill(resampler, input_buffer_glitch, &frames, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    } else {
       // normal case
      seq_idx = seq(input_buffer_normal, input_channels, seq_idx, BUF_BASE_SIZE);
      long normal_input_frame_count = 256;
      got = cubeb_resampler_fill(resampler, input_buffer_normal, &normal_input_frame_count, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    }
    ASSERT_EQ(got, BUF_BASE_SIZE);
  }

  cubeb_resampler_destroy(resampler);
}